

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractDOMParser::endElement
          (AbstractDOMParser *this,XMLElementDecl *param_1,uint param_2,bool param_3,XMLCh *param_4)

{
  short sVar1;
  short sVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  short *psVar5;
  undefined7 in_register_00000009;
  DOMNode *pDVar6;
  short *psVar7;
  undefined4 in_register_00000014;
  DOMDocumentImpl *parsedDocument;
  XIncludeUtils xiu;
  XIncludeUtils XStack_28;
  undefined4 extraout_var_02;
  
  pDVar6 = this->fCurrentParent;
  this->fCurrentNode = pDVar6;
  iVar4 = (*pDVar6->_vptr_DOMNode[5])
                    (pDVar6,param_1,CONCAT44(in_register_00000014,param_2),
                     CONCAT71(in_register_00000009,param_3));
  this->fCurrentParent = (DOMNode *)CONCAT44(extraout_var,iVar4);
  if (((DOMNode *)CONCAT44(extraout_var,iVar4) == (DOMNode *)0x0) &&
     (this->fDocument != (DOMDocumentImpl *)0x0)) {
    iVar4 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x40])();
    this->fCurrentNode = (DOMNode *)CONCAT44(extraout_var_00,iVar4);
    this->fCurrentParent = (DOMNode *)CONCAT44(extraout_var_00,iVar4);
  }
  pDVar6 = &(this->fDocument->super_DOMDocument).super_DOMNode;
  if (this->fDocument == (DOMDocumentImpl *)0x0) {
    pDVar6 = (DOMNode *)0x0;
  }
  if (this->fCurrentParent == pDVar6) {
    this->fWithinElement = false;
  }
  if (this->fDoXInclude != true) {
    return;
  }
  bVar3 = XIncludeUtils::isXIIncludeDOMNode(this->fCurrentNode);
  if (!bVar3) {
    bVar3 = XIncludeUtils::isXIFallbackDOMNode(this->fCurrentNode);
    if (!bVar3) {
      return;
    }
    iVar4 = (*this->fCurrentParent->_vptr_DOMNode[0x16])();
    psVar5 = (short *)CONCAT44(extraout_var_02,iVar4);
    if (psVar5 == &XIncludeUtils::fgXIIIncludeNamespaceURI) {
      return;
    }
    psVar7 = &XIncludeUtils::fgXIIIncludeNamespaceURI;
    if (psVar5 == (short *)0x0) {
LAB_002df952:
      if (*psVar7 == 0) {
        return;
      }
    }
    else {
      do {
        sVar1 = *psVar5;
        if (sVar1 == 0) goto LAB_002df952;
        psVar5 = psVar5 + 1;
        sVar2 = *psVar7;
        psVar7 = psVar7 + 1;
      } while (sVar1 == sVar2);
    }
  }
  XIncludeUtils::XIncludeUtils(&XStack_28,&this->super_XMLErrorReporter);
  parsedDocument = this->fDocument;
  if (parsedDocument != (DOMDocumentImpl *)0x0) {
    parsedDocument = (DOMDocumentImpl *)&parsedDocument->super_DOMDocument;
  }
  bVar3 = XIncludeUtils::parseDOMNodeDoingXInclude
                    (&XStack_28,this->fCurrentNode,(DOMDocument *)parsedDocument,
                     this->fScanner->fEntityHandler);
  if (bVar3) {
    iVar4 = (*this->fCurrentParent->_vptr_DOMNode[8])();
    this->fCurrentNode = (DOMNode *)CONCAT44(extraout_var_01,iVar4);
  }
  XIncludeUtils::~XIncludeUtils(&XStack_28);
  return;
}

Assistant:

void AbstractDOMParser::endElement( const   XMLElementDecl&
                           , const unsigned int
                           , const bool
                           , const XMLCh* const)
{
    fCurrentNode   = fCurrentParent;
    fCurrentParent = fCurrentNode->getParentNode ();

    // When the document is invalid but we continue parsing, we may
    // end up seeing more 'end' events than the 'start' ones.
    //
    if (fCurrentParent == 0 && fDocument != 0)
    {
      fCurrentNode = fDocument->getDocumentElement ();
      fCurrentParent = fCurrentNode;
    }

    // If we've hit the end of content, clear the flag.
    //
    if (fCurrentParent == fDocument)
        fWithinElement = false;

    if(fDoXInclude &&
       (XIncludeUtils::isXIIncludeDOMNode(fCurrentNode) ||
        ((XIncludeUtils::isXIFallbackDOMNode(fCurrentNode) &&
          !XMLString::equals(fCurrentParent->getNamespaceURI(), XIncludeUtils::fgXIIIncludeNamespaceURI)))))
    {
    	XIncludeUtils xiu((XMLErrorReporter *) this);
	    // process the XInclude node, then update the fCurrentNode with the new content
	    if(xiu.parseDOMNodeDoingXInclude(fCurrentNode, fDocument, getScanner()->getEntityHandler()))
            fCurrentNode = fCurrentParent->getLastChild();
    }
}